

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O1

int luaopen_jit(lua_State *L)

{
  uint64_t uVar1;
  int iVar2;
  uint uVar3;
  uint32_t features [4];
  uint32_t vendor [4];
  undefined1 auStack_58 [8];
  uint local_50;
  uint local_48 [4];
  undefined1 local_38 [4];
  uint local_34;
  
  uVar1 = (L->glref).ptr64;
  iVar2 = lj_vm_cpuid(0,local_48);
  uVar3 = 0;
  if (iVar2 != 0) {
    iVar2 = lj_vm_cpuid(1,auStack_58);
    uVar3 = 0;
    if ((iVar2 != 0) && (uVar3 = local_50 >> 0xe & 0x20 | (local_50 & 1) << 4, 6 < local_48[0])) {
      lj_vm_cpuid(7,local_38);
      uVar3 = uVar3 | local_34 >> 2 & 0x40;
    }
  }
  *(uint *)(uVar1 + 0x388) = uVar3 | 0x3ff0001;
  ((int32_t *)(uVar1 + 0x940))[0] = 8000;
  ((int32_t *)(uVar1 + 0x940))[1] = 16000;
  ((int32_t *)(uVar1 + 0x948))[0] = 500;
  ((int32_t *)(uVar1 + 0x948))[1] = 100;
  ((int32_t *)(uVar1 + 0x950))[0] = 500;
  ((int32_t *)(uVar1 + 0x950))[1] = 3;
  ((int32_t *)(uVar1 + 0x958))[0] = 0x38;
  ((int32_t *)(uVar1 + 0x958))[1] = 10;
  ((int32_t *)(uVar1 + 0x960))[0] = 4;
  ((int32_t *)(uVar1 + 0x960))[1] = 4;
  ((int32_t *)(uVar1 + 0x968))[0] = 0xf;
  ((int32_t *)(uVar1 + 0x968))[1] = 3;
  ((int32_t *)(uVar1 + 0x96c))[0] = 3;
  ((int32_t *)(uVar1 + 0x96c))[1] = 2;
  ((int32_t *)(uVar1 + 0x974))[0] = 0x40;
  ((int32_t *)(uVar1 + 0x974))[1] = 0xa000;
  lj_dispatch_update((global_State *)(L->glref).ptr64);
  lua_pushlstring(L,"Linux",5);
  lua_pushlstring(L,"x64",3);
  lua_pushinteger(L,0x4e84);
  lua_pushlstring(L,"LuaJIT 2.1.0-beta3",0x12);
  lj_lib_register(L,"jit",lj_lib_init_jit,lj_lib_cf_jit);
  lj_lib_prereg(L,"jit.profile",luaopen_jit_profile,(GCtab *)(L->env).gcptr64);
  lj_lib_prereg(L,"jit.util",luaopen_jit_util,(GCtab *)(L->env).gcptr64);
  lj_lib_register(L,"jit.opt",lj_lib_init_jit_opt,lj_lib_cf_jit_opt);
  L->top = L->top + -2;
  return 1;
}

Assistant:

LUALIB_API int luaopen_jit(lua_State *L)
{
#if LJ_HASJIT
  jit_init(L);
#endif
  lua_pushliteral(L, LJ_OS_NAME);
  lua_pushliteral(L, LJ_ARCH_NAME);
  lua_pushinteger(L, LUAJIT_VERSION_NUM);
  lua_pushliteral(L, LUAJIT_VERSION);
  LJ_LIB_REG(L, LUA_JITLIBNAME, jit);
#if LJ_HASPROFILE
  lj_lib_prereg(L, LUA_JITLIBNAME ".profile", luaopen_jit_profile,
		tabref(L->env));
#endif
#ifndef LUAJIT_DISABLE_JITUTIL
  lj_lib_prereg(L, LUA_JITLIBNAME ".util", luaopen_jit_util, tabref(L->env));
#endif
#if LJ_HASJIT
  LJ_LIB_REG(L, "jit.opt", jit_opt);
#endif
  L->top -= 2;
  return 1;
}